

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O3

bitwidth_t __thiscall slang::SVInt::countLeadingOnesSlowCase(SVInt *this)

{
  uint64_t *puVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  
  uVar9 = (this->super_SVIntStorage).bitWidth;
  uVar10 = uVar9 & 0x3f;
  uVar6 = (uVar9 + 0x3f >> 6) << ((this->super_SVIntStorage).unknownFlag & 0x1fU);
  bVar5 = 0x40 - (char)uVar10;
  uVar9 = 0x40;
  if (uVar10 != 0) {
    uVar9 = uVar10;
  }
  puVar1 = (this->super_SVIntStorage).field_0.pVal;
  if (uVar10 == 0) {
    bVar5 = 0;
  }
  uVar4 = puVar1[(ulong)uVar6 - 1] << (bVar5 & 0x3f) ^ 0xffffffffffffffff;
  if (uVar4 == 0) {
    uVar10 = 0x40;
  }
  else {
    lVar3 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    uVar10 = (uint)lVar3 ^ 0x3f;
  }
  if (1 < uVar6 && uVar9 == uVar10) {
    uVar10 = (uVar6 * 0x40 + uVar9) - 0x40;
    iVar7 = uVar6 - 1;
    do {
      uVar4 = puVar1[iVar7 - 1];
      if (uVar4 != 0xffffffffffffffff) {
        uVar4 = uVar4 ^ 0xffffffffffffffff;
        if (uVar4 == 0) {
          uVar6 = 0x40;
        }
        else {
          lVar3 = 0x3f;
          if (uVar4 != 0) {
            for (; uVar4 >> lVar3 == 0; lVar3 = lVar3 + -1) {
            }
          }
          uVar6 = (uint)lVar3 ^ 0x3f;
        }
        return uVar6 + uVar9;
      }
      uVar9 = uVar9 + 0x40;
      iVar8 = iVar7 + -1;
      bVar2 = 0 < iVar7;
      iVar7 = iVar8;
    } while (iVar8 != 0 && bVar2);
  }
  return uVar10;
}

Assistant:

bitwidth_t SVInt::countLeadingOnesSlowCase() const {
    bitwidth_t bitsInMsw = bitWidth % BITS_PER_WORD;
    uint32_t shift = 0;
    if (!bitsInMsw)
        bitsInMsw = BITS_PER_WORD;
    else
        shift = BITS_PER_WORD - bitsInMsw;

    int i = int(getNumWords() - 1);
    bitwidth_t count = (bitwidth_t)std::countl_one(pVal[i] << shift);
    if (count == bitsInMsw) {
        for (i--; i >= 0; i--) {
            if (pVal[i] == UINT64_MAX)
                count += BITS_PER_WORD;
            else {
                count += (bitwidth_t)std::countl_one(pVal[i]);
                break;
            }
        }
    }

    return count;
}